

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen12dGPUResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen12dGPUResource_DISABLED_TestPlanarYfCompressedResource_Test::TestBody
          (CTestGen12dGPUResource_DISABLED_TestPlanarYfCompressedResource_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar1;
  short sVar2;
  uint32_t ExpectedValue;
  double dVar3;
  double dVar4;
  CTestGen12dGPUResource_DISABLED_TestPlanarYfCompressedResource_Test *this_00;
  bool bVar5;
  undefined4 uVar6;
  uint uVar7;
  long lVar8;
  GMM_RESOURCE_INFO *pGVar9;
  long *plVar10;
  uint32_t ExpectedValue_00;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  undefined4 local_100;
  uint local_fc;
  ulong local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  ulong uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  CTestGen12dGPUResource_DISABLED_TestPlanarYfCompressedResource_Test *local_68;
  double local_60;
  GMM_RESOURCE_INFO *local_58;
  internal local_50 [8];
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  
  uStack_90 = 0;
  local_d8 = 0;
  uStack_c0 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  local_b8 = 0;
  uStack_b0 = 0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_88 = 0;
  local_100 = 2;
  local_98 = 0x100000000;
  local_f8 = 0x400000002;
  uStack_d0 = 0x100;
  local_c8 = 0x100000050;
  local_f0 = 0x3000100000;
  lVar15 = 0;
  local_68 = this;
  do {
    local_fc = *(uint *)((long)&DAT_001a4d30 + lVar15);
    uVar13 = (ulong)local_fc;
    lVar8 = (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x80))();
    sVar2 = *(short *)(lVar8 + 0x1814 + uVar13 * 0x14);
    uVar7 = 1;
    uVar12 = 0;
    if (sVar2 != 8) {
      if (sVar2 != 0x10) {
        return;
      }
      uVar12 = 1;
      uVar7 = 2;
    }
    local_f8 = local_f8 | 0x2000000000;
    local_70 = lVar15;
    pGVar9 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_100);
    local_58 = (GMM_RESOURCE_INFO *)(double)uVar12;
    exp2((double)local_58);
    local_78 = (ulong)uVar12;
    exp2((double)local_58);
    uVar13 = uStack_d0 >> 1;
    local_58 = (GMM_RESOURCE_INFO *)(double)uVar7;
    dVar3 = exp2((double)local_58);
    uVar12 = (&DAT_001a6150)[(ulong)uVar7 * 2];
    local_80 = (ulong)uVar12;
    local_60 = (double)(ulong)(uint)(&DAT_001a6154)[(ulong)uVar7 * 2];
    uVar14 = uStack_d0 >> 1;
    dVar4 = exp2((double)local_58);
    this_00 = local_68;
    ExpectedValue_00 =
         ((int)uVar13 * (int)dVar3 + -1 + uVar12 * 4) -
         ((int)uVar14 * (int)dVar4 + -1 + uVar12 * 4 & uVar12 * 4 - 1);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)local_68,pGVar9,ExpectedValue_00);
    uVar7 = (&DAT_001a6150)[local_78 * 2];
    ExpectedValue = (&DAT_001a6154)[local_78 * 2];
    CTestResource::VerifyResourcePitchInTiles<true>
              ((CTestResource *)this_00,pGVar9,ExpectedValue_00 / uVar7);
    uVar13 = local_80;
    CTestResource::VerifyResourceSize<true>
              ((CTestResource *)this_00,pGVar9,
               (long)(int)(((int)((ulong)((int)((ulong)(-SUB84(local_60,0) &
                                                       (((uint)local_c8 >> 1) - 1) +
                                                       SUB84(local_60,0)) /
                                               ((ulong)local_60 & 0xffffffff)) * ExpectedValue_00) /
                                 (local_80 & 0xffffffff)) +
                           (((-ExpectedValue & ((uint)local_c8 - 1) + ExpectedValue) / ExpectedValue
                            ) * ExpectedValue_00) / uVar7) * 0x1000));
    local_60 = (double)(long)uVar13;
    dVar3 = exp2((double)local_58);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this_00,pGVar9,(uint32_t)(long)(local_60 / dVar3));
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this_00,pGVar9,ExpectedValue);
    local_38.ptr_._0_4_ = 0x10000;
    local_58 = pGVar9;
    uVar6 = (**(code **)(*(long *)pGVar9 + 0x148))(pGVar9);
    gtest_ar.message_.ptr_._0_4_ = uVar6;
    psVar1 = &gtest_ar.message_;
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_50,"((64) * 1024)","ResourceInfo->GetBaseAlignment()",(int *)&local_38,
               (uint *)psVar1);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar11 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar11 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                 ,0x540,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (((local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_38.ptr_ = local_38.ptr_ & 0xffffffff00000000;
    uVar6 = (**(code **)(*(long *)local_58 + 400))();
    gtest_ar.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (CONCAT44(gtest_ar.message_.ptr_._4_4_,uVar6) & 0xffffffff00000003);
    testing::internal::CmpHelperEQ<int,unsigned_int>
              (local_50,"0","ResourceInfo->GetRenderPitchTiles() % 4",(int *)&local_38,
               (uint *)psVar1);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar11 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar11 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                 ,0x541,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (((local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (((CommonULT::pGfxAdapterInfo->SkuTable).field_1.field_0x2 & 4) != 0) {
      gtest_ar.message_.ptr_ = gtest_ar.message_.ptr_ & 0xffffffff00000000;
      uVar7 = (**(code **)(*(long *)local_58 + 0x2a0))(local_58,1);
      local_38.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)(uVar7 & 0xfff);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_50,"0","ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS) % 4096",
                 (int *)psVar1,(unsigned_long *)&local_38);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)psVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                   ,0x545,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
        if (((local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pGVar9 = local_58;
      local_38.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (**(code **)(*(long *)local_58 + 0x2a8))(local_58,1);
      uVar13 = (**(code **)(*(long *)pGVar9 + 0x280))(pGVar9);
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar13 >> 8);
      testing::internal::CmpHelperGE<unsigned_long,unsigned_long>
                (local_50,"ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS)",
                 "ResourceInfo->GetSizeMainSurface() >> 8",(unsigned_long *)&local_38,
                 (unsigned_long *)psVar1);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_38);
        pcVar11 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar11 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)psVar1,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                   ,0x546,pcVar11);
        testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
        if (((local_38.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
           (local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_38.ptr_ + 8))();
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    gtest_ar.message_.ptr_._0_4_ = 0x2000;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*(long *)local_58 + 0x2a8))(local_58,1);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_50,"((4) * 1024) * 2","ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS)",
               (int *)psVar1,(unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar11 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar11 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                 ,0x549,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (((local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_f8 = local_f8 & 0xffffffdfffffffff;
    plVar10 = (long *)(**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                                (CommonULT::pGmmULTClientContext,&local_100);
    gtest_ar.message_.ptr_._0_4_ = 0x2000;
    local_38.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (**(code **)(*plVar10 + 0x288))(plVar10);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              (local_50,"((4) * 1024) * 2","AuxResourceInfo->GetSizeSurface()",
               (int *)&gtest_ar.message_,(unsigned_long *)&local_38);
    if (local_50[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_38);
      pcVar11 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar11 = *(char **)gtest_ar._0_8_;
      }
      psVar1 = &gtest_ar.message_;
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)psVar1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/projectceladon[P]gmmlib/Source/GmmLib/ULT/GmmGen12dGPUResourceULT.cpp"
                 ,0x551,pcVar11);
      testing::internal::AssertHelper::operator=((AssertHelper *)psVar1,(Message *)&local_38);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)psVar1);
      if (((local_38.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar5 = testing::internal::IsTrue(true), bVar5)) &&
         (local_38.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_38.ptr_ + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,plVar10);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,local_58);
    lVar15 = local_70 + 4;
  } while (lVar15 != 0x10);
  return;
}

Assistant:

TEST_F(CTestGen12dGPUResource, DISABLED_TestPlanarYfCompressedResource)
{
    const uint32_t TileSize[TEST_BPP_MAX][2] = {
    {64, 64}, {128, 32}, {128, 32}, {256, 16}, {256, 16}}; // TileYf

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Gpu.Texture    = 1;
    //gmmParams.Flags.Gpu.MMC = 1;
    gmmParams.Flags.Gpu.CCS              = 1;
    gmmParams.Flags.Info.MediaCompressed = 1;
    gmmParams.BaseWidth64                = 0x100;
    gmmParams.BaseHeight                 = 0x50;
    gmmParams.Depth                      = 0x1;
    SetTileFlag(gmmParams, TEST_TILEYF); // TileYF only

    //UV-Packed formats
    GMM_RESOURCE_FORMAT Format[4] = {GMM_FORMAT_NV12, GMM_FORMAT_NV21, GMM_FORMAT_P010, GMM_FORMAT_P016};
    for(auto fmt : Format)
    {
        gmmParams.Format = fmt; // 8bpp (NV12, NV21), 16bpp (P016,P010)

        TEST_BPP Ybpp, UVbpp;
        //Yf/Ys could be accessed on CPU/app where UV plane bpp is double
        switch(pGmmULTClientContext->GetPlatformInfo().FormatTable[fmt].Element.BitsPer)
        {
            case 8:
                Ybpp  = TEST_BPP_8;
                UVbpp = TEST_BPP_16;
                break;
            case 16:
                Ybpp  = TEST_BPP_16;
                UVbpp = TEST_BPP_32;
                break;
            default:
                return;
        }
        gmmParams.Flags.Gpu.UnifiedAuxSurface = 1;

        /*Aux is TileY (later Linear), not redescribing, its bytes are allocated using one bpp*/
        GMM_TILE_MODE TileMode = DEFINE_TILE(YF_2D, Ybpp);

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        //Redescribed Pitch isn't modified unless Y, UV pitch differ
        //But, original Pitch is padded to have even Tile, hence use Ybpp ExpectedPitch
        //to verify Pitch, but redescribed size
        uint32_t ExpectedPitch    = GMM_ULT_ALIGN(gmmParams.BaseWidth64 * (int)pow(2.0, Ybpp), TileSize[Ybpp][0] * 4);
        uint32_t RedescribedPitch = GMM_ULT_ALIGN(gmmParams.BaseWidth64 / 2 * (int)pow(2.0, UVbpp), TileSize[UVbpp][0] * 4);

        //ExpectedPitch = GMM_ULT_ALIGN(ExpectedPitch, 2 * TileSize[Ybpp][0]);   //pad to even tile
        if(ExpectedPitch != RedescribedPitch)
        {
            ExpectedPitch = RedescribedPitch;
        }

        VerifyResourcePitch<true>(ResourceInfo, ExpectedPitch);
        VerifyResourcePitchInTiles<true>(ResourceInfo, ExpectedPitch / TileSize[Ybpp][0]);

        int YSizeInTiles = (GMM_ULT_ALIGN(gmmParams.BaseHeight, TileSize[Ybpp][1]) / TileSize[Ybpp][1]) *
                           RedescribedPitch / TileSize[Ybpp][0];
        int UVSizeInTiles = (GMM_ULT_ALIGN(gmmParams.BaseHeight / 2, TileSize[UVbpp][1]) / TileSize[UVbpp][1]) *
                            RedescribedPitch / TileSize[UVbpp][0];

        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4) * (YSizeInTiles + UVSizeInTiles));
        VerifyResourceHAlign<true>(ResourceInfo, TileSize[UVbpp][0] / pow(2.0, UVbpp)); // For Yf/Ys planar redescription causes UV width, Y height alignment
        VerifyResourceVAlign<true>(ResourceInfo, TileSize[Ybpp][1]);
        VerifyResourceQPitch<false>(ResourceInfo, 0); // N/A for non-mipped surface

        //test main surface base alignment is 16KB
        //For Yf test main surface pitch is 4-tileYF aligned
        EXPECT_EQ(GMM_KBYTE(64), ResourceInfo->GetBaseAlignment());
        EXPECT_EQ(0, ResourceInfo->GetRenderPitchTiles() % 4); // Check on YF only

        if(const_cast<SKU_FEATURE_TABLE &>(pGfxAdapterInfo->SkuTable).FtrLinearCCS)
        {
            EXPECT_EQ(0, ResourceInfo->GetUnifiedAuxSurfaceOffset(GMM_AUX_CCS) % PAGE_SIZE);
            EXPECT_GE(ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS), ResourceInfo->GetSizeMainSurface() >> 8);
        }

        EXPECT_EQ(GMM_KBYTE(4) * 2, ResourceInfo->GetSizeAuxSurface(GMM_AUX_CCS)); // Y and UV Aux are on separate tiles

        { //separate Aux
            gmmParams.Flags.Gpu.UnifiedAuxSurface = 0;

            GMM_RESOURCE_INFO *AuxResourceInfo;
            AuxResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

            EXPECT_EQ(GMM_KBYTE(4) * 2, AuxResourceInfo->GetSizeSurface());

            pGmmULTClientContext->DestroyResInfoObject(AuxResourceInfo);
        }
        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}